

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void CP_ReaderActivateHandler
               (CManager cm,CMConnection conn,void *Msg_v,void *client_data,attr_list attrs)

{
  long *plVar1;
  void *__ptr;
  long *in_RDX;
  WS_ReaderInfo CP_WSR_Stream;
  _ReaderActivateMsg *Msg;
  char *tmpstr;
  
  if (_perfstubs_initialized == 1) {
    if (CP_ReaderActivateHandler::timer == (void *)0x0) {
      __ptr = (void *)ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/cp/cp_writer.c"
                                          ,"CP_ReaderActivateHandler",0x9c2);
      CP_ReaderActivateHandler::timer = (void *)ps_timer_create_(__ptr);
      free(__ptr);
    }
    ps_timer_start_(CP_ReaderActivateHandler::timer);
  }
  plVar1 = (long *)*in_RDX;
  CP_verbose((SstStream)*plVar1,PerStepVerbose,
             "Reader Activate message received for Stream %p.  Setting state to Established.\n",
             plVar1);
  CP_verbose((SstStream)*plVar1,PerStepVerbose,"Parent stream reader count is now %d.\n",
             (ulong)*(uint *)(*plVar1 + 0x188));
  pthread_mutex_lock((pthread_mutex_t *)(*plVar1 + 0xc0));
  *(undefined4 *)(plVar1 + 1) = 2;
  pthread_cond_signal((pthread_cond_t *)(*plVar1 + 0xe8));
  pthread_mutex_unlock((pthread_mutex_t *)(*plVar1 + 0xc0));
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(CP_ReaderActivateHandler::timer);
  }
  return;
}

Assistant:

void CP_ReaderActivateHandler(CManager cm, CMConnection conn, void *Msg_v, void *client_data,
                              attr_list attrs)
{
    PERFSTUBS_TIMER_START_FUNC(timer);
    struct _ReaderActivateMsg *Msg = (struct _ReaderActivateMsg *)Msg_v;

    WS_ReaderInfo CP_WSR_Stream = Msg->WSR_Stream;
    CP_verbose(CP_WSR_Stream->ParentStream, PerStepVerbose,
               "Reader Activate message received "
               "for Stream %p.  Setting state to "
               "Established.\n",
               CP_WSR_Stream);
    CP_verbose(CP_WSR_Stream->ParentStream, PerStepVerbose,
               "Parent stream reader count is now %d.\n", CP_WSR_Stream->ParentStream->ReaderCount);
    STREAM_MUTEX_LOCK(CP_WSR_Stream->ParentStream);
    CP_WSR_Stream->ReaderStatus = Established;
    /*
     * the main thread might be waiting for this
     */
    pthread_cond_signal(&CP_WSR_Stream->ParentStream->DataCondition);
    STREAM_MUTEX_UNLOCK(CP_WSR_Stream->ParentStream);
    PERFSTUBS_TIMER_STOP_FUNC(timer);
}